

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hpp
# Opt level: O2

vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
* __thiscall
crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>::crossover
          (vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           *__return_storage_ptr__,
          DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_> *this,
          vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
          *parents)

{
  pointer pCVar1;
  __normal_iterator<Gen_*,_std::vector<Gen,_std::allocator<Gen>_>_> _Var2;
  uint uVar3;
  result_type rVar4;
  uniform_int_distribution<unsigned_long> uni;
  random_device rd;
  mt19937 rng;
  uniform_int_distribution<unsigned_long> local_2730;
  random_device local_2720;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_1398;
  
  std::
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::vector(__return_storage_ptr__,parents);
  std::random_device::random_device(&local_2720);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_1398,(ulong)uVar3);
  pCVar1 = (parents->
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_2730._M_param._M_b =
       ((long)*(pointer *)
               ((long)&(pCVar1->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl + 8) -
        *(long *)&(pCVar1->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                  super__Vector_impl_data >> 4) - 1;
  local_2730._M_param._M_a = 0;
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&local_2730,&local_1398);
  pCVar1 = (__return_storage_ptr__->
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (pCVar1->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::
  swap_ranges<__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>,__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>>
            (_Var2,_Var2._M_current + rVar4,
             pCVar1[1]._genes.super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
             super__Vector_impl_data._M_start);
  rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&local_2730,&local_1398);
  pCVar1 = (__return_storage_ptr__->
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       pCVar1[1]._genes.super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::
  swap_ranges<__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>,__gnu_cxx::__normal_iterator<Gen*,std::vector<Gen,std::allocator<Gen>>>>
            (_Var2,_Var2._M_current + rVar4,
             (pCVar1->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::random_device::~random_device(&local_2720);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ChromosomeT> crossover(const std::vector<ChromosomeT> &parents) const
    {
        std::vector<ChromosomeT> children(parents);
        //Select a random crossover point
        std::random_device rd;                                                       // used once to initialise (seed) engine
        std::mt19937 rng(rd());                                                      // random-number engine used (Mersenne-Twister in this case)
        std::uniform_int_distribution<size_t> uni(0u, parents[0].getNumGenes() - 1); // guaranteed unbiased
        auto crossOverPoint = uni(rng);
        std::swap_ranges(children[0].getGenes().begin(),
                         children[0].getGenes().begin() + crossOverPoint,
                         children[1].getGenes().begin());
        crossOverPoint = uni(rng);
        std::swap_ranges(children[1].getGenes().begin(),
                         children[1].getGenes().begin() + crossOverPoint,
                         children[0].getGenes().begin());
        return children;
    }